

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_pixel_format.cpp
# Opt level: O0

char * crnlib::pixel_format_helpers::get_crn_format_string(crn_format fmt)

{
  crn_format fmt_local;
  char *local_8;
  
  switch(fmt) {
  case cCRNFmtDXT1:
    local_8 = "DXT1";
    break;
  case cCRNFmtDXT3:
    local_8 = "DXT3";
    break;
  case cCRNFmtDXT5:
    local_8 = "DXT5";
    break;
  case cCRNFmtDXT5_CCxY:
    local_8 = "DXT5_CCxY";
    break;
  case cCRNFmtDXT5_xGxR:
    local_8 = "DXT5_xGxR";
    break;
  case cCRNFmtDXT5_xGBR:
    local_8 = "DXT5_xGBR";
    break;
  case cCRNFmtDXT5_AGBR:
    local_8 = "DXT5_AGBR";
    break;
  case cCRNFmtDXN_XY:
    local_8 = "DXN_XY";
    break;
  case cCRNFmtDXN_YX:
    local_8 = "DXN_YX";
    break;
  case cCRNFmtDXT5A:
    local_8 = "DXT5A";
    break;
  case cCRNFmtETC1:
    local_8 = "ETC1";
    break;
  case cCRNFmtETC2:
    local_8 = "ETC2";
    break;
  case cCRNFmtETC2A:
    local_8 = "ETC2A";
    break;
  case cCRNFmtETC1S:
    local_8 = "ETC1S";
    break;
  case cCRNFmtETC2AS:
    local_8 = "ETC2AS";
    break;
  default:
    local_8 = "?";
  }
  return local_8;
}

Assistant:

const char* get_crn_format_string(crn_format fmt) {
  switch (fmt) {
    case cCRNFmtDXT1:
      return "DXT1";
    case cCRNFmtDXT3:
      return "DXT3";
    case cCRNFmtDXT5:
      return "DXT5";
    case cCRNFmtDXT5_CCxY:
      return "DXT5_CCxY";
    case cCRNFmtDXT5_xGBR:
      return "DXT5_xGBR";
    case cCRNFmtDXT5_AGBR:
      return "DXT5_AGBR";
    case cCRNFmtDXT5_xGxR:
      return "DXT5_xGxR";
    case cCRNFmtDXN_XY:
      return "DXN_XY";
    case cCRNFmtDXN_YX:
      return "DXN_YX";
    case cCRNFmtDXT5A:
      return "DXT5A";
    case cCRNFmtETC1:
      return "ETC1";
    case cCRNFmtETC2:
      return "ETC2";
    case cCRNFmtETC2A:
      return "ETC2A";
    case cCRNFmtETC1S:
      return "ETC1S";
    case cCRNFmtETC2AS:
      return "ETC2AS";
    default:
      break;
  }
  CRNLIB_ASSERT(false);
  return "?";
}